

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

size_t readmoredata(char *buffer,size_t size,size_t nitems,void *userp)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  size_t __n;
  
  lVar1 = *userp;
  lVar2 = *(long *)(lVar1 + 0x1e8);
  if (*(long *)(lVar2 + 8) == 0) {
    __n = 0;
  }
  else {
    __n = nitems * size;
    *(ushort *)(lVar1 + 0x660) =
         (ushort)*(undefined4 *)(lVar1 + 0x660) & 0xfeff |
         (ushort)(*(int *)(lVar2 + 0x208) == 1) << 8;
    if ((long)__n < (long)*(size_t *)(lVar2 + 8)) {
      memcpy(buffer,*(void **)(lVar2 + 0x10),__n);
      *(long *)(lVar2 + 0x10) = *(long *)(lVar2 + 0x10) + __n;
      *(long *)(lVar2 + 8) = *(long *)(lVar2 + 8) - __n;
    }
    else {
      memcpy(buffer,*(void **)(lVar2 + 0x10),*(size_t *)(lVar2 + 8));
      __n = *(size_t *)(lVar2 + 8);
      if (*(long *)(lVar2 + 0x200) == 0) {
        *(undefined8 *)(lVar2 + 8) = 0;
      }
      else {
        *(undefined8 *)(lVar2 + 0x10) = *(undefined8 *)(lVar2 + 0x1f8);
        *(long *)(lVar2 + 8) = *(long *)(lVar2 + 0x200);
        lVar1 = *userp;
        uVar3 = *(undefined8 *)(lVar2 + 0x1f0);
        *(undefined8 *)(lVar1 + 0x1508) = *(undefined8 *)(lVar2 + 0x1e8);
        *(undefined8 *)(lVar1 + 0x1510) = uVar3;
        *(int *)(lVar2 + 0x208) = *(int *)(lVar2 + 0x208) + 1;
        *(undefined8 *)(lVar2 + 0x200) = 0;
      }
    }
  }
  return __n;
}

Assistant:

static size_t readmoredata(char *buffer,
                           size_t size,
                           size_t nitems,
                           void *userp)
{
  struct connectdata *conn = (struct connectdata *)userp;
  struct HTTP *http = conn->data->req.protop;
  size_t fullsize = size * nitems;

  if(!http->postsize)
    /* nothing to return */
    return 0;

  /* make sure that a HTTP request is never sent away chunked! */
  conn->data->req.forbidchunk = (http->sending == HTTPSEND_REQUEST)?TRUE:FALSE;

  if(http->postsize <= (curl_off_t)fullsize) {
    memcpy(buffer, http->postdata, (size_t)http->postsize);
    fullsize = (size_t)http->postsize;

    if(http->backup.postsize) {
      /* move backup data into focus and continue on that */
      http->postdata = http->backup.postdata;
      http->postsize = http->backup.postsize;
      conn->data->state.fread_func = http->backup.fread_func;
      conn->data->state.in = http->backup.fread_in;

      http->sending++; /* move one step up */

      http->backup.postsize = 0;
    }
    else
      http->postsize = 0;

    return fullsize;
  }

  memcpy(buffer, http->postdata, fullsize);
  http->postdata += fullsize;
  http->postsize -= fullsize;

  return fullsize;
}